

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_resetAllIdsSet_Test::~Clone_resetAllIdsSet_Test(Clone_resetAllIdsSet_Test *this)

{
  Clone_resetAllIdsSet_Test *this_local;
  
  ~Clone_resetAllIdsSet_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, resetAllIdsSet)
{
    auto r = libcellml::Reset::create();
    r->setId("unique");
    r->setResetValueId("rId");
    r->setTestValueId("tId");

    auto rClone = r->clone();

    compareReset(r, rClone);
}